

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalGetFileTime
                    (CPalThread *pThread,HANDLE hFile,LPFILETIME lpCreationTime,
                    LPFILETIME lpLastAccessTime,LPFILETIME lpLastWriteTime)

{
  DWORD DVar1;
  int iVar2;
  LONG LVar3;
  undefined1 local_d8 [8];
  stat StatData;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  
  pLocalDataLock = (IDataLock *)0x0;
  StatData.__glibc_reserved[2] = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if ((undefined1 *)hFile != &DAT_ffffffffffffffff) {
    DVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
    if (DVar1 != 0) goto LAB_002c1db6;
    DVar1 = (*pLocalDataLock->_vptr_IDataLock[3])
                      (pLocalDataLock,pThread,0,&pLocalData,StatData.__glibc_reserved + 2);
    if (DVar1 != 0) goto LAB_002c1db6;
    if (*(int *)(StatData.__glibc_reserved[2] + 8) != -1) {
      iVar2 = fstat64(*(int *)(StatData.__glibc_reserved[2] + 8),(stat64 *)local_d8);
      if (iVar2 == 0) {
        if (lpCreationTime != (LPFILETIME)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c1e88;
          *lpCreationTime = (_FILETIME)(StatData.st_mtim.tv_nsec * 10000000 + 0x19db1ded53e8000);
        }
        if (lpLastWriteTime != (LPFILETIME)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c1e88;
          *lpLastWriteTime = (_FILETIME)(StatData.st_atim.tv_nsec * 10000000 + 0x19db1ded53e8000);
        }
        if (lpLastAccessTime != (LPFILETIME)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c1e88;
          *lpLastAccessTime = (_FILETIME)(StatData.st_blocks * 10000000 + 0x19db1ded53e8000);
          if (lpLastWriteTime != (LPFILETIME)0x0) {
            LVar3 = CompareFileTime(lpLastAccessTime,lpLastWriteTime);
            if (LVar3 < 0) {
              *lpLastAccessTime = *lpLastWriteTime;
            }
          }
        }
        goto LAB_002c1db6;
      }
      if (PAL_InitializeChakraCoreCalled != false) {
        DVar1 = FILEGetLastErrorFromErrno();
        goto LAB_002c1db6;
      }
      goto LAB_002c1e88;
    }
  }
  DVar1 = 6;
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_002c1e88:
    abort();
  }
LAB_002c1db6:
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return DVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetFileTime(
        CPalThread *pThread,
        IN HANDLE hFile,
        OUT LPFILETIME lpCreationTime,
        OUT LPFILETIME lpLastAccessTime,
        OUT LPFILETIME lpLastWriteTime)
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    int   Fd = -1;

    struct stat StatData;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileTimeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTimeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTimeExit;
    }

    Fd = pLocalData->unix_fd;

    if ( Fd == -1 )
    {
        TRACE("pLocalData = [%p], Fd = %d\n", pLocalData, Fd);
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileTimeExit;
    }

    if ( fstat(Fd, &StatData) != 0 )
    {
        TRACE("fstat failed on file descriptor %d\n", Fd);
        palError = FILEGetLastErrorFromErrno();
        goto InternalGetFileTimeExit;
    }

    if ( lpCreationTime )
    {
        *lpCreationTime = FILEUnixTimeToFileTime(StatData.st_ctime,
                                                 ST_CTIME_NSEC(&StatData));
    }
    if ( lpLastWriteTime )
    {
        *lpLastWriteTime = FILEUnixTimeToFileTime(StatData.st_mtime,
                                                  ST_MTIME_NSEC(&StatData));
    }
    if ( lpLastAccessTime )
    {
        *lpLastAccessTime = FILEUnixTimeToFileTime(StatData.st_atime,
                                                   ST_ATIME_NSEC(&StatData));
        /* if Unix mtime is greater than atime, return mtime as the last
           access time */
        if ( lpLastWriteTime &&
             CompareFileTime(lpLastAccessTime, lpLastWriteTime) < 0 )
        {
            *lpLastAccessTime = *lpLastWriteTime;
        }
    }

InternalGetFileTimeExit:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}